

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O1

void __thiscall r_comp::Decompiler::write_indent(Decompiler *this,uint16_t i)

{
  ushort uVar1;
  undefined6 in_register_00000032;
  char local_19;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->out_stream->stream,"\n",1);
  this->indents = i;
  if ((int)CONCAT62(in_register_00000032,i) != 0) {
    uVar1 = 0;
    do {
      local_19 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this->out_stream->stream,&local_19,1);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->indents);
  }
  return;
}

Assistant:

void Decompiler::write_indent(uint16_t i)
{
    *out_stream << "\n";
    indents = i;

    for (uint16_t j = 0; j < indents; j++) {
        *out_stream << ' ';
    }
}